

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool Internal_FirstIsPartOfSecond(ON_SubDComponentPoint *first,ON_SubDComponentPoint *second)

{
  ulong uVar1;
  Type TVar2;
  Type TVar3;
  uint uVar4;
  ulong uVar5;
  ON_SubDVertex *vertex;
  ON_SubDFace *f;
  ON_SubDFace *pOVar6;
  
  TVar2 = ON_SubDComponentPtr::ComponentType(&first->m_component_ptr);
  TVar3 = ON_SubDComponentPtr::ComponentType(&second->m_component_ptr);
  if (TVar2 == TVar3) {
    return false;
  }
  if (TVar2 == Vertex) {
    uVar1 = (first->m_component_ptr).m_ptr;
    vertex = (ON_SubDVertex *)(uVar1 & 0xfffffffffffffff8);
    if (vertex == (ON_SubDVertex *)0x0 || ((uint)uVar1 & 6) != 2) {
      return false;
    }
    if (TVar3 != Face) {
      if (TVar3 != Edge) {
        return false;
      }
      uVar1 = (second->m_component_ptr).m_ptr;
      uVar5 = uVar1 & 0xfffffffffffffff8;
      if (uVar5 == 0 || ((uint)uVar1 & 6) != 4) {
        return false;
      }
      if (*(ON_SubDVertex **)(uVar5 + 0x80) == vertex) {
        return true;
      }
      if (*(ON_SubDVertex **)(uVar5 + 0x88) != vertex) {
        return false;
      }
      return true;
    }
    uVar1 = (second->m_component_ptr).m_ptr;
    pOVar6 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    if (pOVar6 == (ON_SubDFace *)0x0 || (~(uint)uVar1 & 6) != 0) {
      return false;
    }
    uVar4 = ON_SubDFace::VertexIndex(pOVar6,vertex);
  }
  else {
    if (TVar3 != Face || TVar2 != Edge) {
      return false;
    }
    uVar1 = (first->m_component_ptr).m_ptr;
    pOVar6 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    if (((uint)uVar1 & 6) != 4) {
      pOVar6 = (ON_SubDFace *)0x0;
    }
    uVar1 = (second->m_component_ptr).m_ptr;
    f = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
    if ((~(uint)uVar1 & 6) != 0) {
      f = (ON_SubDFace *)0x0;
    }
    if (f == (ON_SubDFace *)0x0 || pOVar6 == (ON_SubDFace *)0x0) {
      return false;
    }
    uVar4 = ON_SubDEdge::FaceArrayIndex((ON_SubDEdge *)pOVar6,f);
  }
  if (uVar4 == 0xffffffff) {
    return false;
  }
  return true;
}

Assistant:

static const bool Internal_FirstIsPartOfSecond(
  const ON_SubDComponentPoint& first,
  const ON_SubDComponentPoint& second
)
{
  // returns true if first is topologically part of second (vertex on edge, vertex on face, or edge on face).
  const ON_SubDComponentPtr::Type first_type = first.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type second_type = second.m_component_ptr.ComponentType();
  if (first_type != second_type)
  {
    if (ON_SubDComponentPtr::Type::Vertex == first_type)
    {
      const ON_SubDVertex* v = first.m_component_ptr.Vertex();
      if (nullptr != v)
      {
        if (ON_SubDComponentPtr::Type::Edge == second_type)
        {
          const ON_SubDEdge* e = second.m_component_ptr.Edge();
          if (nullptr != e && (v == e->m_vertex[0] || v == e->m_vertex[1]))
            return true;
        }
        else if (ON_SubDComponentPtr::Type::Face == second_type)
        {
          const ON_SubDFace* f = second.m_component_ptr.Face();
          if (nullptr != f && f->VertexIndex(v) < ON_UNSET_UINT_INDEX)
            return true;
        }
      }
    }
    else if (ON_SubDComponentPtr::Type::Edge == first_type)
    {
      if (ON_SubDComponentPtr::Type::Face == second_type)
      {
        const ON_SubDEdge* e = first.m_component_ptr.Edge();
        const ON_SubDFace* f = second.m_component_ptr.Face();
        if (nullptr != e && nullptr != f && e->FaceArrayIndex(f) < ON_UNSET_UINT_INDEX)
          return true;
      }
    }
  }
  return false;
}